

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load.c
# Opt level: O3

json_t * parse_value(lex_t *lex,size_t flags,json_error_t *error)

{
  int *value;
  size_t __n;
  int iVar1;
  ulong uVar2;
  json_t *json;
  void *pvVar3;
  json_t *pjVar4;
  size_t sVar5;
  ulong uVar6;
  char *pcVar7;
  char *pcVar8;
  ulong uVar9;
  ulong __size;
  
  uVar2 = lex->depth + 1;
  lex->depth = uVar2;
  if (0x800 < uVar2) {
    pcVar7 = "maximum parsing depth reached";
    goto LAB_00106cad;
  }
  iVar1 = lex->token;
  if (iVar1 < 0x100) {
    if (iVar1 == -1) {
      pcVar7 = "invalid token";
      goto LAB_00106cad;
    }
    if (iVar1 == 0x5b) {
      json = json_array();
      if (json == (json_t *)0x0) {
        return (json_t *)0x0;
      }
      lex_scan(lex,error);
      if (lex->token != 0) {
        if (lex->token == 0x5d) goto LAB_00106fcf;
        do {
          pjVar4 = parse_value(lex,flags,error);
          if (pjVar4 == (json_t *)0x0) goto LAB_00106f78;
          if (pjVar4->refcount != 0xffffffffffffffff) {
            pjVar4->refcount = pjVar4->refcount + 1;
          }
          iVar1 = json_array_append_new(json,pjVar4);
          sVar5 = pjVar4->refcount;
          if (iVar1 != 0) {
            if ((sVar5 == 0xffffffffffffffff) || (pjVar4->refcount = sVar5 - 1, sVar5 - 1 != 0))
            goto LAB_00106f78;
            goto LAB_0010732c;
          }
          if ((sVar5 != 0xffffffffffffffff) && (pjVar4->refcount = sVar5 - 1, sVar5 - 1 == 0)) {
            json_delete(pjVar4);
          }
          lex_scan(lex,error);
          if (lex->token != 0x2c) {
            if (lex->token == 0x5d) goto LAB_00106fc6;
            break;
          }
          lex_scan(lex,error);
        } while (lex->token != 0);
      }
      pcVar7 = "\']\' expected";
    }
    else {
      if (iVar1 != 0x7b) goto switchD_00106ceb_default;
      json = json_object();
      if (json == (json_t *)0x0) {
        return (json_t *)0x0;
      }
      lex_scan(lex,error);
      if (lex->token == 0x7d) goto LAB_00106fcf;
      if (lex->token == 0x100) {
        do {
          pcVar7 = (lex->value).string.val;
          __n = (lex->value).string.len;
          (lex->value).string.val = (char *)0x0;
          (lex->value).string.len = 0;
          if (pcVar7 == (char *)0x0) {
            return (json_t *)0x0;
          }
          pvVar3 = memchr(pcVar7,0,__n);
          if (pvVar3 != (void *)0x0) {
            jsonp_free(pcVar7);
            pcVar7 = "NUL byte in object key not supported";
            goto LAB_00106f6b;
          }
          if (((flags & 1) != 0) && (pjVar4 = json_object_get(json,pcVar7), pjVar4 != (json_t *)0x0)
             ) {
            jsonp_free(pcVar7);
            pcVar7 = "duplicate object key";
            goto LAB_00106f6b;
          }
          lex_scan(lex,error);
          if (lex->token != 0x3a) {
            jsonp_free(pcVar7);
            pcVar7 = "\':\' expected";
            goto LAB_00106f6b;
          }
          lex_scan(lex,error);
          pjVar4 = parse_value(lex,flags,error);
          if (pjVar4 == (json_t *)0x0) {
            jsonp_free(pcVar7);
            goto LAB_00106f78;
          }
          if (pjVar4->refcount != 0xffffffffffffffff) {
            pjVar4->refcount = pjVar4->refcount + 1;
          }
          iVar1 = json_object_set_new_nocheck(json,pcVar7,pjVar4);
          if (iVar1 != 0) {
            jsonp_free(pcVar7);
            if ((pjVar4->refcount != 0xffffffffffffffff) &&
               (sVar5 = pjVar4->refcount - 1, pjVar4->refcount = sVar5, sVar5 == 0)) {
LAB_0010732c:
              json_delete(pjVar4);
            }
            goto LAB_00106f78;
          }
          if ((pjVar4->refcount != 0xffffffffffffffff) &&
             (sVar5 = pjVar4->refcount - 1, pjVar4->refcount = sVar5, sVar5 == 0)) {
            json_delete(pjVar4);
          }
          jsonp_free(pcVar7);
          lex_scan(lex,error);
          if (lex->token != 0x2c) {
            if (lex->token == 0x7d) goto LAB_00106fc6;
            pcVar7 = "\'}\' expected";
            goto LAB_00106f6b;
          }
          lex_scan(lex,error);
        } while (lex->token == 0x100);
      }
      pcVar7 = "string or \'}\' expected";
    }
LAB_00106f6b:
    error_set(error,lex,pcVar7);
LAB_00106f78:
    if ((json->refcount != 0xffffffffffffffff) &&
       (sVar5 = json->refcount - 1, json->refcount = sVar5, sVar5 == 0)) {
      json_delete(json);
    }
  }
  else {
    switch(iVar1) {
    case 0x100:
      value = (int *)(lex->value).string.val;
      uVar2 = (lex->value).string.len;
      if ((uVar2 < 7) || (*(int *)((long)value + 3) != 0x3a3a4d45 || *value != 0x454d3a3a)) {
        if (((flags & 0x10) != 0) || (pvVar3 = memchr(value,0,uVar2), pvVar3 == (void *)0x0)) {
          json = jsonp_stringn_nocheck_own((char *)value,uVar2);
          if (json == (json_t *)0x0) {
            return (json_t *)0x0;
          }
          (lex->value).string.val = (char *)0x0;
          (lex->value).string.len = 0;
          goto LAB_00106fcf;
        }
        pcVar7 = "\\u0000 is not allowed without JSON_ALLOW_NUL";
        goto LAB_00106cad;
      }
      __size = uVar2 - 7 >> 1;
      pcVar7 = (char *)malloc(__size);
      if (pcVar7 == (char *)0x0) {
        return (json_t *)0x0;
      }
      pcVar8 = pcVar7;
      for (uVar9 = (long)value + 7; uVar9 < uVar2 + (long)value; uVar9 = uVar9 + uVar6) {
        if (uVar9 + 0x20 < uVar2 + (long)value) {
          __isoc99_sscanf(uVar9,
                          "%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx"
                          ,pcVar8,pcVar8 + 1,pcVar8 + 2,pcVar8 + 3,pcVar8 + 4,pcVar8 + 5,pcVar8 + 6,
                          pcVar8 + 7,pcVar8 + 8,pcVar8 + 9,pcVar8 + 10,pcVar8 + 0xb,pcVar8 + 0xc,
                          pcVar8 + 0xd,pcVar8 + 0xe,pcVar8 + 0xf,pcVar8 + 0x10,pcVar8 + 0x11,
                          pcVar8 + 0x12,pcVar8 + 0x13,pcVar8 + 0x14,pcVar8 + 0x15,pcVar8 + 0x16,
                          pcVar8 + 0x17,pcVar8 + 0x18,pcVar8 + 0x19,pcVar8 + 0x1a,pcVar8 + 0x1b,
                          pcVar8 + 0x1c,pcVar8 + 0x1d,pcVar8 + 0x1e,pcVar8 + 0x1f);
          uVar6 = 0x40;
        }
        else {
          __isoc99_sscanf(uVar9,"%02hhx",pcVar8);
          uVar6 = 2;
        }
        pcVar8 = pcVar8 + (uVar6 >> 1);
      }
      json = json_mem_own(pcVar7,__size);
      break;
    case 0x101:
      json = json_integer((lex->value).integer);
      break;
    case 0x102:
      json = json_real((lex->value).real);
      break;
    case 0x103:
      json = json_true();
      break;
    case 0x104:
      json = json_false();
      break;
    case 0x105:
      json = json_null();
      break;
    default:
switchD_00106ceb_default:
      pcVar7 = "unexpected token";
LAB_00106cad:
      error_set(error,lex,pcVar7);
      return (json_t *)0x0;
    }
LAB_00106fc6:
    if (json != (json_t *)0x0) {
LAB_00106fcf:
      lex->depth = lex->depth - 1;
      return json;
    }
  }
  return (json_t *)0x0;
}

Assistant:

static json_t *parse_value(lex_t *lex, size_t flags, json_error_t *error)
{
	json_t *json;

	lex->depth++;
	if (lex->depth > JSON_PARSER_MAX_DEPTH) {
		error_set(error, lex, "maximum parsing depth reached");
		return NULL;
	}

	switch (lex->token) {
	case TOKEN_STRING: {
		const char *value = lex->value.string.val;
		size_t len = lex->value.string.len;
		unsigned char * temp, *mem;
		const char *pos;

		if (len >= MEM_TOKEN_LEN && !memcmp(value, MEM_TOKEN, MEM_TOKEN_LEN))
		{
			len = len - MEM_TOKEN_LEN;
			value = value + MEM_TOKEN_LEN;
			mem = temp = malloc(len / 2);
			if (!temp)
				return NULL;

			size_t num_read;
			for (pos = value; pos < value + len; pos += num_read, temp += num_read / 2)
			{
				if (pos + 0x20 < value + len)
				{
					sscanf(pos, 
						"%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx"
						"%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx",
						temp, temp + 1, temp + 2, temp + 3, temp + 4, temp + 5, temp + 6, temp + 7,
						temp + 8, temp + 9, temp + 10, temp + 11, temp + 12, temp + 13, temp + 14, temp + 15,
						temp + 16, temp + 17, temp + 18, temp + 19, temp + 20, temp + 21, temp + 22, temp + 23,
						temp + 24, temp + 25, temp + 26, temp + 27, temp + 28, temp + 29, temp + 30, temp + 31);
					num_read = 0x40;
				}
				else
				{
					sscanf(pos, "%02hhx", temp);
					num_read = 2;
				}
			}
			json = json_mem_own(mem, len / 2);
		}
		else
		{

			if (!(flags & JSON_ALLOW_NUL)) {
				if (memchr(value, '\0', len)) {
					error_set(error, lex, "\\u0000 is not allowed without JSON_ALLOW_NUL");
					return NULL;
				}
			}

			json = jsonp_stringn_nocheck_own(value, len);
			if (json) {
				lex->value.string.val = NULL;
				lex->value.string.len = 0;
			}
		}
		break;
	}

	case TOKEN_INTEGER: {
		json = json_integer(lex->value.integer);
		break;
	}

	case TOKEN_REAL: {
		json = json_real(lex->value.real);
		break;
	}

	case TOKEN_TRUE:
		json = json_true();
		break;

	case TOKEN_FALSE:
		json = json_false();
		break;

	case TOKEN_NULL:
		json = json_null();
		break;

	case '{':
		json = parse_object(lex, flags, error);
		break;

	case '[':
		json = parse_array(lex, flags, error);
		break;

	case TOKEN_INVALID:
		error_set(error, lex, "invalid token");
		return NULL;

	default:
		error_set(error, lex, "unexpected token");
		return NULL;
	}

	if (!json)
		return NULL;

	lex->depth--;
	return json;
}